

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

bool glcts::verifyFace<unsigned_int,1u,3u,3u>
               (uint *data,GLuint cube_face,uint *expected_values,GLuint image_width)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  GLuint x;
  long lVar5;
  
  iVar2 = cube_face * 3;
  iVar3 = cube_face * 9;
  for (uVar4 = 0; uVar4 != 3; uVar4 = uVar4 + 1) {
    lVar5 = 0;
    while (lVar5 != 3) {
      iVar1 = (int)lVar5;
      lVar5 = lVar5 + 1;
      if (data[(uint)(iVar2 + iVar1)] != expected_values[(uint)(iVar3 + iVar1)]) goto LAB_00d455fa;
    }
    iVar3 = iVar3 + 3;
    iVar2 = iVar2 + image_width;
  }
LAB_00d455fa:
  return 2 < uVar4;
}

Assistant:

bool verifyFace(const T* data, const glw::GLuint cube_face, const T* expected_values, const glw::GLuint image_width)
{
	static const glw::GLuint size_of_pixel = N_Components;

	const glw::GLuint data_face_offset  = N_Components * Width * cube_face;
	const glw::GLuint exp_face_offset   = N_Components * Width * Height * cube_face;
	const glw::GLuint data_size_of_line = image_width * size_of_pixel;
	const glw::GLuint exp_size_of_line  = Width * size_of_pixel;

	for (glw::GLuint y = 0; y < Height; ++y)
	{
		const glw::GLuint data_line_offset = y * data_size_of_line;
		const glw::GLuint exp_line_offset  = y * exp_size_of_line;

		for (glw::GLuint x = 0; x < Width; ++x)
		{
			const glw::GLuint data_pixel_offset = data_line_offset + data_face_offset + x * size_of_pixel;
			const glw::GLuint exp_pixel_offset  = exp_line_offset + exp_face_offset + x * size_of_pixel;

			for (glw::GLuint component = 0; component < N_Components; ++component)
			{
				if (data[data_pixel_offset + component] != expected_values[exp_pixel_offset + component])
				{
					return false;
				}
			}
		}
	}

	return true;
}